

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameworkIntegrations.cpp
# Opt level: O0

void ApprovalTests::FrameworkIntegrations::setTestPassedNotification
               (TestPassedNotification *notification)

{
  function<void_()> *in_stack_ffffffffffffffc8;
  function<void_()> *in_stack_ffffffffffffffd0;
  
  ::std::function<void_()>::function(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  FileApprover::setTestPassedNotification((TestPassedNotification *)0x11e965);
  ::std::function<void_()>::~function((function<void_()> *)0x11e971);
  return;
}

Assistant:

void FrameworkIntegrations::setTestPassedNotification(
        FileApprover::TestPassedNotification notification)
    {
        FileApprover::setTestPassedNotification(notification);
    }